

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::Message(Message *this,string *string,DataDictionary *dataDictionary,bool validate)

{
  message_order local_50;
  
  local_50.m_mode = normal;
  local_50._4_8_ = 0;
  local_50.m_groupOrder._4_8_ = 0;
  local_50._20_8_ = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_50);
  shared_array<int>::~shared_array(&local_50.m_groupOrder);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_001fd438;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

EXCEPT(InvalidMessage)
    : m_validStructure(true),
      m_tag(0) {
  setString(string, validate, &dataDictionary, &dataDictionary);
}